

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Round::applyPoint
          (Interval *__return_storage_ptr__,Round *this,EvalContext *param_1,double x)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double truncated;
  double local_10;
  
  local_10 = 0.0;
  dVar4 = modf(x,&local_10);
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  if (ABS(dVar4) <= 0.5) {
    bVar2 = NAN(local_10);
    dVar8 = INFINITY;
    if (!bVar2) {
      dVar8 = local_10;
    }
    uVar5 = 0;
    uVar6 = 0xfff00000;
    dVar9 = -INFINITY;
    if (!bVar2) {
      dVar9 = local_10;
    }
    __return_storage_ptr__->m_hasNaN = bVar2;
    dVar7 = INFINITY;
    if (dVar8 <= INFINITY) {
      dVar7 = dVar8;
    }
    if (-INFINITY <= dVar9) {
      uVar5 = SUB84(dVar9,0);
      uVar6 = (undefined4)((ulong)dVar9 >> 0x20);
    }
    __return_storage_ptr__->m_lo = dVar7;
    __return_storage_ptr__->m_hi = (double)CONCAT44(uVar6,uVar5);
  }
  else {
    dVar7 = INFINITY;
    uVar5 = 0;
    uVar6 = 0xfff00000;
    bVar2 = false;
  }
  if (0.5 <= ABS(dVar4)) {
    local_10 = (double)(int)((uint)(0.0 < dVar4) - (uint)(dVar4 < 0.0)) + local_10;
    bVar1 = NAN(local_10);
    dVar4 = local_10;
    if (bVar1) {
      local_10 = -INFINITY;
      dVar4 = INFINITY;
    }
    uVar3 = -(ulong)(local_10 <= (double)CONCAT44(uVar6,uVar5));
    __return_storage_ptr__->m_hasNaN = (bool)(bVar2 | bVar1);
    __return_storage_ptr__->m_lo =
         (double)(-(ulong)(dVar7 <= dVar4) & (ulong)dVar7 | ~-(ulong)(dVar7 <= dVar4) & (ulong)dVar4
                 );
    __return_storage_ptr__->m_hi =
         (double)(uVar3 & CONCAT44(uVar6,uVar5) | ~uVar3 & (ulong)local_10);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval	applyPoint	(const EvalContext&, double x) const
	{
		double			truncated	= 0.0;
		const double	fract		= deModf(x, &truncated);
		Interval		ret;

		if (fabs(fract) <= 0.5)
			ret |= truncated;
		if (fabs(fract) >= 0.5)
			ret |= truncated + deSign(fract);

		return ret;
	}